

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  long lVar2;
  ostream *poVar3;
  char **in_RSI;
  int in_EDI;
  size_t pos;
  exception *e;
  copy_filter flt;
  service srv;
  string captured;
  submitter *in_stack_fffffffffffffc78;
  function<void_()> *in_stack_fffffffffffffc80;
  bool *in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  value *in_stack_fffffffffffffc98;
  allocator *paVar4;
  string local_320 [32];
  copy_filter local_300 [464];
  submitter local_130 [5];
  allocator local_101;
  string local_100 [32];
  mount_point local_e0 [40];
  undefined1 local_b8 [23];
  allocator local_a1;
  string local_a0 [32];
  mount_point local_80 [40];
  undefined1 local_58 [19];
  undefined1 local_45;
  service local_38 [8];
  string local_30 [32];
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_30);
  cppcms::service::service(local_38,local_8,local_10);
  cppcms::service::settings();
  local_45 = 0;
  write_tests = cppcms::json::value::get<bool>
                          (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                           in_stack_fffffffffffffc88);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<async_test>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"/async",&local_a1);
  cppcms::mount_point::mount_point(local_80,local_a0);
  cppcms::applications_pool::mount(uVar1,local_58,local_80,1);
  cppcms::mount_point::~mount_point(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10c88f);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<sync_test>();
  paVar4 = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"/sync",paVar4);
  cppcms::mount_point::mount_point(local_e0,local_100);
  cppcms::applications_pool::mount(uVar1,local_b8,local_e0,0);
  cppcms::mount_point::~mount_point(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10c948);
  submitter::submitter(local_130,local_38);
  std::function<void()>::function<submitter,void>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  cppcms::service::after_fork((function *)local_38);
  std::function<void_()>::~function((function<void_()> *)0x10c99a);
  cppcms::copy_filter::copy_filter(local_300,(ostream *)&std::cerr);
  cppcms::service::run();
  cppcms::copy_filter::detach_abi_cxx11_();
  std::__cxx11::string::operator=(local_30,local_320);
  std::__cxx11::string::~string(local_320);
  cppcms::copy_filter::~copy_filter(local_300);
  cppcms::service::~service(local_38);
  while (lVar2 = std::__cxx11::string::find((char *)local_30,0x1110ae), lVar2 != -1) {
    count_timeouts = count_timeouts + 1;
  }
  if ((write_tests & 1U) == 0) {
    if (((eof_detected & 1U) == 0) || (count_timeouts != 5)) goto LAB_0010cccb;
  }
  else if (((async_bad_count != 2) ||
           (((sync_bad_count != 2 || (count_timeouts != 4)) || (above_3to != 2)))) ||
          (below_2to != 2)) {
LAB_0010cccb:
    print_count_report((ostream *)0x10ccd7);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    goto LAB_0010cdb7;
  }
  print_count_report((ostream *)0x10cd2a);
  if ((run_ok & 1U) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Python script failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
LAB_0010cdb7:
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc,char **argv)
{
	std::string captured;
	try {
		cppcms::service srv(argc,argv);
		write_tests = srv.settings().get("test.write",false);
		srv.applications_pool().mount( 	cppcms::create_pool<async_test>(),
						cppcms::mount_point("/async"),
						cppcms::app::asynchronous);
		srv.applications_pool().mount( cppcms::create_pool<sync_test>(), cppcms::mount_point("/sync"));
		srv.after_fork(submitter(srv));
		cppcms::copy_filter flt(std::cerr); // record the log
		srv.run();
		captured = flt.detach(); // get the log
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	size_t pos = 0;
	while((pos=captured.find("Timeout on connection",pos))!=std::string::npos) {
		pos+=10;
		count_timeouts++;
	}
	if(
		write_tests ?
		(
			async_bad_count != 2 
			|| sync_bad_count != 2 
			|| count_timeouts != 4
			|| above_3to != 2
			|| below_2to != 2
		)
		:
		(
			!eof_detected 
			|| count_timeouts != 5
		)
	  ) 
	{
		print_count_report(std::cerr);
		std::cerr << "Failed" << std::endl;
		return EXIT_FAILURE;
	}
	print_count_report(std::cout);
	if(!run_ok ) {
		std::cerr << "Python script failed" << std::endl;
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
}